

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v7::detail::fallback_format<double>
               (double d,int num_digits,bool binary32,buffer<char> *buf,int *exp10)

{
  char *pcVar1;
  size_t sVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined7 in_register_00000031;
  byte bVar8;
  long lVar9;
  ulong uVar10;
  bigint *lhs2;
  ulong uVar11;
  uint64_t value;
  bool bVar12;
  bool bVar13;
  float fVar14;
  bigint numerator;
  bigint denominator;
  bigint lower;
  bigint upper_store;
  bigint *local_318;
  bigint local_2f0;
  bigint local_240;
  bigint local_190;
  bigint local_e0;
  
  local_2f0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_2f0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_006a6af0;
  local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ = local_2f0.bigits_.store_;
  local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_2f0.exp_ = 0;
  local_240.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_240.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_006a6af0;
  local_240.bigits_.super_buffer<unsigned_int>.ptr_ = local_240.bigits_.store_;
  local_240.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_240.exp_ = 0;
  local_190.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_190.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_006a6af0;
  local_190.bigits_.super_buffer<unsigned_int>.ptr_ = local_190.bigits_.store_;
  local_190.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_190.exp_ = 0;
  local_318 = &local_e0;
  local_e0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_e0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_006a6af0;
  local_e0.bigits_.super_buffer<unsigned_int>.ptr_ = local_e0.bigits_.store_;
  local_e0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_e0.exp_ = 0;
  if ((int)CONCAT71(in_register_00000031,binary32) == 0) {
    uVar10 = (ulong)d & 0xfffffffffffff;
    uVar6 = (uint)((ulong)d >> 0x34) & 0x7ff;
    uVar11 = uVar10 + 0x10000000000000;
    if (uVar6 == 0) {
      uVar11 = uVar10;
    }
    iVar4 = -0x432;
    if (uVar6 != 0) {
      iVar4 = uVar6 - 0x433;
    }
    bVar13 = uVar10 == 0;
    bVar12 = uVar6 < 2;
  }
  else {
    fVar14 = (float)d;
    uVar6 = (uint)fVar14 & 0x7fffff;
    uVar11 = (ulong)uVar6 + 0x800000;
    if ((uint)fVar14 < 0x800000) {
      uVar11 = (ulong)uVar6;
    }
    iVar4 = -0x95;
    if ((uint)fVar14 >= 0x800000) {
      iVar4 = ((uint)fVar14 >> 0x17) - 0x96;
    }
    bVar13 = uVar6 == 0;
    bVar12 = (uint)fVar14 < 0x1000000;
  }
  bVar8 = !bVar12 & bVar13;
  iVar7 = bVar8 + 1;
  value = uVar11 << (sbyte)iVar7;
  if (iVar4 < 0) {
    if (*exp10 < 0) {
      bigint::assign_pow10(&local_2f0,-*exp10);
      sVar2 = local_2f0.bigits_.super_buffer<unsigned_int>.size_;
      if (local_190.bigits_.super_buffer<unsigned_int>.capacity_ <
          local_2f0.bigits_.super_buffer<unsigned_int>.size_) {
        (**local_190.bigits_.super_buffer<unsigned_int>._vptr_buffer)
                  (&local_190,local_2f0.bigits_.super_buffer<unsigned_int>.size_);
      }
      local_190.bigits_.super_buffer<unsigned_int>.size_ =
           local_190.bigits_.super_buffer<unsigned_int>.capacity_;
      if (sVar2 <= local_190.bigits_.super_buffer<unsigned_int>.capacity_) {
        local_190.bigits_.super_buffer<unsigned_int>.size_ = sVar2;
      }
      if (sVar2 != 0) {
        memmove(local_190.bigits_.super_buffer<unsigned_int>.ptr_,
                local_2f0.bigits_.super_buffer<unsigned_int>.ptr_,sVar2 << 2);
      }
      sVar2 = local_2f0.bigits_.super_buffer<unsigned_int>.size_;
      local_190.exp_ = local_2f0.exp_;
      if (bVar8 == 0) {
        local_318 = (bigint *)0x0;
      }
      else {
        if (local_e0.bigits_.super_buffer<unsigned_int>.capacity_ <
            local_2f0.bigits_.super_buffer<unsigned_int>.size_) {
          (**local_e0.bigits_.super_buffer<unsigned_int>._vptr_buffer)
                    (&local_e0,local_2f0.bigits_.super_buffer<unsigned_int>.size_);
        }
        local_e0.bigits_.super_buffer<unsigned_int>.size_ =
             local_e0.bigits_.super_buffer<unsigned_int>.capacity_;
        if (sVar2 <= local_e0.bigits_.super_buffer<unsigned_int>.capacity_) {
          local_e0.bigits_.super_buffer<unsigned_int>.size_ = sVar2;
        }
        if (sVar2 != 0) {
          memmove(local_e0.bigits_.super_buffer<unsigned_int>.ptr_,
                  local_2f0.bigits_.super_buffer<unsigned_int>.ptr_,sVar2 << 2);
        }
        local_318 = &local_e0;
        local_e0.exp_ = local_2f0.exp_;
        bigint::operator<<=(local_318,1);
      }
      bigint::operator*=(&local_2f0,value);
      bigint::assign(&local_240,1);
      bigint::operator<<=(&local_240,iVar7 - iVar4);
    }
    else {
      bigint::assign(&local_2f0,value);
      bigint::assign_pow10(&local_240,*exp10);
      bigint::operator<<=(&local_240,iVar7 - iVar4);
      bigint::assign(&local_190,1);
      if (bVar8 == 0) {
        local_318 = (bigint *)0x0;
      }
      else {
        bigint::assign(&local_e0,2);
      }
    }
  }
  else {
    bigint::assign(&local_2f0,value);
    bigint::operator<<=(&local_2f0,iVar4);
    bigint::assign(&local_190,1);
    bigint::operator<<=(&local_190,iVar4);
    if (bVar8 == 0) {
      local_318 = (bigint *)0x0;
    }
    else {
      local_318 = &local_e0;
      bigint::assign(local_318,1);
      bigint::operator<<=(&local_e0,iVar4 + 1);
    }
    bigint::assign_pow10(&local_240,*exp10);
    bigint::operator<<=(&local_240,iVar7);
  }
  if (-1 < num_digits) {
    *exp10 = *exp10 - (num_digits + -1);
    uVar6 = num_digits - 1;
    if (num_digits == 0) {
      if (buf->capacity_ == 0) {
        (**buf->_vptr_buffer)(buf,1);
      }
      buf->size_ = (ulong)(buf->capacity_ != 0);
      bigint::multiply(&local_240,10);
      iVar4 = add_compare(&local_2f0,&local_2f0,&local_240);
      *buf->ptr_ = 0 < iVar4 | 0x30;
    }
    else {
      uVar11 = (ulong)(uint)num_digits;
      if (buf->capacity_ < uVar11) {
        (**buf->_vptr_buffer)(buf,uVar11);
      }
      uVar10 = buf->capacity_;
      if (uVar11 <= buf->capacity_) {
        uVar10 = uVar11;
      }
      buf->size_ = uVar10;
      if (1 < num_digits) {
        uVar10 = 0;
        do {
          iVar4 = bigint::divmod_assign(&local_2f0,&local_240);
          buf->ptr_[uVar10] = (char)iVar4 + '0';
          bigint::multiply(&local_2f0,10);
          uVar10 = uVar10 + 1;
        } while (uVar6 != uVar10);
      }
      uVar5 = bigint::divmod_assign(&local_2f0,&local_240);
      iVar4 = add_compare(&local_2f0,&local_2f0,&local_240);
      if ((0 < iVar4) || ((uVar5 & 1) != 0 && iVar4 == 0)) {
        if (uVar5 == 9) {
          buf->ptr_[(int)uVar6] = ':';
          if (1 < num_digits) {
            do {
              if (buf->ptr_[uVar11 - 1] != ':') break;
              buf->ptr_[uVar11 - 1] = '0';
              buf->ptr_[uVar11 - 2] = buf->ptr_[uVar11 - 2] + '\x01';
              uVar11 = uVar11 - 1;
            } while (1 < (long)uVar11);
          }
          if (*buf->ptr_ == ':') {
            *buf->ptr_ = '1';
            *exp10 = *exp10 + 1;
          }
          goto LAB_00494850;
        }
        uVar5 = uVar5 + 1;
      }
      buf->ptr_[(int)uVar6] = (char)uVar5 + '0';
    }
    goto LAB_00494850;
  }
  lhs2 = local_318;
  if (local_318 == (bigint *)0x0) {
    lhs2 = &local_190;
  }
  pcVar1 = buf->ptr_;
  uVar6 = ~(uint)uVar11 & 1;
  lVar9 = 0;
  while( true ) {
    uVar5 = bigint::divmod_assign(&local_2f0,&local_240);
    iVar4 = compare(&local_2f0,&local_190);
    iVar7 = add_compare(&local_2f0,lhs2,&local_240);
    pcVar1[lVar9] = (char)uVar5 + '0';
    if ((iVar4 < (int)uVar6) || ((int)-uVar6 < iVar7)) break;
    bigint::multiply(&local_2f0,10);
    bigint::multiply(&local_190,10);
    if (local_318 != (bigint *)0x0) {
      bigint::multiply(lhs2,10);
    }
    lVar9 = lVar9 + 1;
  }
  if (iVar4 < (int)uVar6) {
    if ((int)-uVar6 < iVar7) {
      iVar4 = add_compare(&local_2f0,&local_2f0,&local_240);
      if ((0 < iVar4) || ((uVar5 & 1) != 0 && iVar4 == 0)) {
        cVar3 = pcVar1[lVar9] + '\x01';
        goto LAB_0049470a;
      }
    }
  }
  else {
    cVar3 = (char)uVar5 + '1';
LAB_0049470a:
    pcVar1[lVar9] = cVar3;
  }
  uVar11 = lVar9 + 1U & 0xffffffff;
  if (buf->capacity_ < uVar11) {
    (**buf->_vptr_buffer)(buf,uVar11);
  }
  if (buf->capacity_ < uVar11) {
    uVar11 = buf->capacity_;
  }
  buf->size_ = uVar11;
  *exp10 = *exp10 - (int)lVar9;
LAB_00494850:
  bigint::~bigint(&local_e0);
  bigint::~bigint(&local_190);
  bigint::~bigint(&local_240);
  bigint::~bigint(&local_2f0);
  return;
}

Assistant:

void fallback_format(Double d, int num_digits, bool binary32, buffer<char>& buf,
                     int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  const bool is_predecessor_closer =
      binary32 ? value.assign(static_cast<float>(d)) : value.assign(d);
  int shift = is_predecessor_closer ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= shift;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  if (num_digits < 0) {
    // Generate the shortest representation.
    if (!upper) upper = &lower;
    bool even = (value.f & 1) == 0;
    num_digits = 0;
    char* data = buf.data();
    for (;;) {
      int digit = numerator.divmod_assign(denominator);
      bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
      // numerator + upper >[=] pow10:
      bool high = add_compare(numerator, *upper, denominator) + even > 0;
      data[num_digits++] = static_cast<char>('0' + digit);
      if (low || high) {
        if (!low) {
          ++data[num_digits - 1];
        } else if (high) {
          int result = add_compare(numerator, numerator, denominator);
          // Round half to even.
          if (result > 0 || (result == 0 && (digit % 2) != 0))
            ++data[num_digits - 1];
        }
        buf.try_resize(to_unsigned(num_digits));
        exp10 -= num_digits - 1;
        return;
      }
      numerator *= 10;
      lower *= 10;
      if (upper != &lower) *upper *= 10;
    }
  }
  // Generate the given number of digits.
  exp10 -= num_digits - 1;
  if (num_digits == 0) {
    buf.try_resize(1);
    denominator *= 10;
    buf[0] = add_compare(numerator, numerator, denominator) > 0 ? '1' : '0';
    return;
  }
  buf.try_resize(to_unsigned(num_digits));
  for (int i = 0; i < num_digits - 1; ++i) {
    int digit = numerator.divmod_assign(denominator);
    buf[i] = static_cast<char>('0' + digit);
    numerator *= 10;
  }
  int digit = numerator.divmod_assign(denominator);
  auto result = add_compare(numerator, numerator, denominator);
  if (result > 0 || (result == 0 && (digit % 2) != 0)) {
    if (digit == 9) {
      const auto overflow = '0' + 10;
      buf[num_digits - 1] = overflow;
      // Propagate the carry.
      for (int i = num_digits - 1; i > 0 && buf[i] == overflow; --i) {
        buf[i] = '0';
        ++buf[i - 1];
      }
      if (buf[0] == overflow) {
        buf[0] = '1';
        ++exp10;
      }
      return;
    }
    ++digit;
  }
  buf[num_digits - 1] = static_cast<char>('0' + digit);
}